

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADS1115.h
# Opt level: O0

Error __thiscall
ADS1115::ADC<unix_i2c::i2c>::read_register
          (ADC<unix_i2c::i2c> *this,RegisterAddress reg_address,uint16_t *reg)

{
  ssize_t sVar1;
  undefined8 in_RCX;
  size_t __n;
  Error local_28;
  undefined1 local_23;
  undefined1 local_22;
  RegisterAddress local_21;
  Error err;
  uint8_t rx [2];
  uint8_t tx [1];
  uint16_t *reg_local;
  RegisterAddress reg_address_local;
  ADC<unix_i2c::i2c> *this_local;
  
  __n = CONCAT71((int7)((ulong)in_RCX >> 8),reg_address);
  local_21 = reg_address;
  _err = reg;
  local_28 = unix_i2c::i2c::begin(&this->m_impl,this->m_address);
  if (local_28 == NONE) {
    sVar1 = unix_i2c::i2c::write(&this->m_impl,(int)&local_21,(void *)0x1,__n);
    local_28 = (Error)sVar1;
  }
  if (local_28 == NONE) {
    sVar1 = unix_i2c::i2c::read(&this->m_impl,(int)&local_23,(void *)0x2,__n);
    local_28 = (Error)sVar1;
  }
  if (local_28 == NONE) {
    *_err = CONCAT11(local_23,local_22);
  }
  return local_28;
}

Assistant:

Error read_register(RegisterAddress reg_address, uint16_t& reg)
  {
    uint8_t tx[1] = {static_cast<uint8_t>(reg_address)};
    uint8_t rx[2];

    auto err = m_impl.begin(m_address);

    if (err == Error::NONE)
      err = m_impl.write(tx, 1);

    if (err == Error::NONE)
      err = m_impl.read(rx, 2);

    if (err == Error::NONE)
      reg = (rx[0] << 8) | rx[1];

    return err;
  }